

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void DoReadyWeaponToFire(AActor *self,bool prim,bool alt)

{
  player_t *this;
  AWeapon *this_00;
  FState *pFVar1;
  bool bVar2;
  int in_EAX;
  uint uVar3;
  DPSprite *pDVar4;
  FState *pFVar5;
  FSoundID local_38;
  FName local_34;
  
  if (self != (AActor *)0x0) {
    this = self->player;
    if ((this != (player_t *)0x0) && (this_00 = this->ReadyWeapon, this_00 != (AWeapon *)0x0)) {
      local_38.ID = in_EAX;
      bVar2 = AActor::InStateSequence(self,self->state,self->MissileState);
      if ((bVar2) || (bVar2 = AActor::InStateSequence(self,self->state,self->MeleeState), bVar2)) {
        (*(self->super_DThinker).super_DObject._vptr_DObject[0x25])(self);
      }
      if ((this_00->ReadySound).super_FSoundID.ID != 0) {
        pDVar4 = player_t::GetPSprite(this,PSP_WEAPON);
        pFVar1 = pDVar4->State;
        _local_38 = CONCAT44(0x9e,local_38.ID);
        pFVar5 = AActor::FindState((AActor *)this_00,&local_34);
        if ((pFVar1 == pFVar5) &&
           ((((this_00->super_AInventory).field_0x4dc & 2) == 0 ||
            (uVar3 = FRandom::GenRand32(&pr_wpnreadysnd), -1 < (char)uVar3)))) {
          _local_38 = CONCAT44(local_34.Index,(this_00->ReadySound).super_FSoundID.ID);
          S_Sound(self,1,&local_38,1.0,1.0);
        }
      }
      this->WeaponState = this->WeaponState | (ushort)prim + (ushort)alt * 4;
    }
  }
  return;
}

Assistant:

void DoReadyWeaponToFire (AActor *self, bool prim, bool alt)
{
	player_t *player;
	AWeapon *weapon;

	if (!self || !(player = self->player) || !(weapon = player->ReadyWeapon))
	{
		return;
	}

	// Change player from attack state
	if (self->InStateSequence(self->state, self->MissileState) ||
		self->InStateSequence(self->state, self->MeleeState))
	{
		static_cast<APlayerPawn *>(self)->PlayIdle ();
	}

	// Play ready sound, if any.
	if (weapon->ReadySound && player->GetPSprite(PSP_WEAPON)->GetState() == weapon->FindState(NAME_Ready))
	{
		if (!(weapon->WeaponFlags & WIF_READYSNDHALF) || pr_wpnreadysnd() < 128)
		{
			S_Sound (self, CHAN_WEAPON, weapon->ReadySound, 1, ATTN_NORM);
		}
	}

	// Prepare for firing action.
	player->WeaponState |= ((prim ? WF_WEAPONREADY : 0) | (alt ? WF_WEAPONREADYALT : 0));
	return;
}